

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadingInstance.cpp
# Opt level: O0

void __thiscall LoadingInstance::Build(LoadingInstance *this,Instance *instance)

{
  Instance *this_00;
  bool bVar1;
  istream *this_01;
  Task local_2c;
  int local_24;
  int local_20;
  int i;
  int val;
  int numerOfTaks;
  Instance *instance_local;
  LoadingInstance *this_local;
  
  _val = instance;
  instance_local = (Instance *)this;
  this_01 = (istream *)std::istream::operator>>((istream *)this->in,&instance->numProcessors);
  std::istream::operator>>(this_01,&i);
  bVar1 = std::vector<Task,_std::allocator<Task>_>::empty(&_val->tasks);
  if (!bVar1) {
    std::vector<Task,_std::allocator<Task>_>::clear(&_val->tasks);
  }
  local_20 = 0;
  for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
    std::istream::operator>>((istream *)this->in,&local_20);
    this_00 = _val;
    Task::Task(&local_2c,local_20,local_24);
    std::vector<Task,_std::allocator<Task>_>::push_back(&this_00->tasks,&local_2c);
  }
  return;
}

Assistant:

void LoadingInstance::Build(Instance& instance){
	int numerOfTaks;
	(*in) >> instance.numProcessors >> numerOfTaks;
	if(!instance.tasks.empty()) instance.tasks.clear();
	//if previous Instance was already built, replace it's old content

	int val = 0;
	for(int i = 0; i < numerOfTaks; i++){
		(*in) >> val;
		instance.tasks.push_back(Task(val, i));
	}
}